

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall QL_Manager::SetUpOneRelation(QL_Manager *this,char *relName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RelCatEntry *pRVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined3 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  RC RVar11;
  RelCatEntry *rEntry;
  string relString;
  RM_Record relRec;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_88;
  RelCatEntry *local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  RM_Record local_38;
  
  RM_Record::RM_Record(&local_38);
  RVar11 = SM_Manager::GetRelEntry(this->smm,relName,&local_38,&local_60);
  if (RVar11 == 0) {
    pRVar2 = this->relEntries;
    uVar7 = *(undefined3 *)&local_60->field_0x31;
    pRVar2->statsInitialized = local_60->statsInitialized;
    *(undefined3 *)&pRVar2->field_0x31 = uVar7;
    uVar3 = *(undefined8 *)local_60->relName;
    uVar4 = *(undefined8 *)(local_60->relName + 8);
    uVar5 = *(undefined8 *)(local_60->relName + 0x10);
    uVar6 = *(undefined8 *)(local_60->relName + 0x18);
    iVar8 = local_60->indexCount;
    iVar9 = local_60->indexCurrNum;
    iVar10 = local_60->numTuples;
    pRVar2->attrCount = local_60->attrCount;
    pRVar2->indexCount = iVar8;
    pRVar2->indexCurrNum = iVar9;
    pRVar2->numTuples = iVar10;
    *(undefined8 *)(pRVar2->relName + 0x10) = uVar5;
    *(undefined8 *)(pRVar2->relName + 0x18) = uVar6;
    *(undefined8 *)pRVar2->relName = uVar3;
    *(undefined8 *)(pRVar2->relName + 8) = uVar4;
    this->nRels = 1;
    this->nAttrs = local_60->attrCount;
    std::__cxx11::string::string((string *)&local_58,relName,(allocator *)&local_88);
    paVar1 = &local_88.first.field_2;
    local_88.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_58,local_58 + local_50);
    local_88.second = 0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->relToInt,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.first._M_dataplus._M_p);
    }
    local_88.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_58,local_58 + local_50);
    local_88.second = 0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->relToAttrIndex,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.first._M_dataplus._M_p);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    RVar11 = 0;
  }
  RM_Record::~RM_Record(&local_38);
  return RVar11;
}

Assistant:

RC QL_Manager::SetUpOneRelation(const char *relName){
  RC rc = 0;
  RelCatEntry *rEntry;
  RM_Record relRec;
  if((rc = smm.GetRelEntry(relName, relRec, rEntry))){
    return (rc);
  }
  memcpy(relEntries, rEntry, sizeof(RelCatEntry));

  nRels = 1;
  nAttrs = rEntry->attrCount;
  string relString(relName);
  relToInt.insert({relString, 0});
  relToAttrIndex.insert({relString, 0});
  return (0);
}